

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEVPMacAlgorithm.cpp
# Opt level: O2

bool __thiscall OSSLEVPMacAlgorithm::signUpdate(OSSLEVPMacAlgorithm *this,ByteString *dataToSign)

{
  HMAC_CTX *ctx;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  uchar *data;
  ByteString dummy;
  
  bVar1 = MacAlgorithm::signUpdate(&this->super_MacAlgorithm,dataToSign);
  if (bVar1) {
    sVar3 = ByteString::size(dataToSign);
    if (sVar3 == 0) {
      return true;
    }
    ctx = (HMAC_CTX *)this->curCTX;
    data = ByteString::const_byte_str(dataToSign);
    sVar3 = ByteString::size(dataToSign);
    iVar2 = HMAC_Update(ctx,data,sVar3);
    if (iVar2 != 0) {
      return true;
    }
    softHSMLog(3,"signUpdate",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPMacAlgorithm.cpp"
               ,0x5c,"HMAC_Update failed");
    HMAC_CTX_free(this->curCTX);
    this->curCTX = (HMAC_CTX *)0x0;
    ByteString::ByteString(&dummy);
    MacAlgorithm::signFinal(&this->super_MacAlgorithm,&dummy);
    ByteString::~ByteString(&dummy);
  }
  return false;
}

Assistant:

bool OSSLEVPMacAlgorithm::signUpdate(const ByteString& dataToSign)
{
	if (!MacAlgorithm::signUpdate(dataToSign))
	{
		return false;
	}

	// The GOST implementation in OpenSSL will segfault if we update with zero length.
	if (dataToSign.size() == 0) return true;

	if (!HMAC_Update(curCTX, dataToSign.const_byte_str(), dataToSign.size()))
	{
		ERROR_MSG("HMAC_Update failed");

		HMAC_CTX_free(curCTX);
		curCTX = NULL;

		ByteString dummy;
		MacAlgorithm::signFinal(dummy);

		return false;
	}

	return true;
}